

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O3

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,color_quad<unsigned_char,_int> *pDst
          ,uint x,uint y,uint w,uint h,bool flip_xy)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  color_quad<unsigned_char,_int> *pcVar11;
  uint uVar12;
  
  if ((x < this->m_width) && (y < this->m_height)) {
    if (flip_xy) {
      bVar2 = true;
      if (h != 0) {
        uVar1 = 0;
        do {
          if (w != 0) {
            uVar6 = uVar1 + y;
            uVar7 = (ulong)w;
            uVar10 = uVar1;
            uVar8 = x;
            do {
              uVar12 = this->m_width - 1;
              if ((int)uVar8 < (int)uVar12) {
                uVar12 = uVar8;
              }
              if ((int)uVar8 < 0) {
                uVar12 = 0;
              }
              uVar3 = this->m_height - 1;
              if ((int)uVar6 < (int)uVar3) {
                uVar3 = uVar6;
              }
              if ((int)uVar6 < 0) {
                uVar3 = 0;
              }
              pcVar11 = this->m_pPixels;
              uVar4 = uVar3 * this->m_pitch + uVar12;
              pDst[uVar10].field_0.field_0.r = pcVar11[uVar4].field_0.field_0.r;
              pDst[uVar10].field_0.field_0.g = pcVar11[uVar4].field_0.field_0.g;
              pDst[uVar10].field_0.field_0.b = pcVar11[uVar4].field_0.field_0.b;
              pDst[uVar10].field_0.field_0.a = pcVar11[uVar4].field_0.field_0.a;
              uVar10 = uVar10 + h;
              uVar8 = uVar8 + 1;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
          uVar1 = uVar1 + 1;
        } while (uVar1 != h);
        bVar2 = true;
      }
    }
    else {
      bVar2 = true;
      if (this->m_width < w + x || this->m_height < h + y) {
        if (h != 0) {
          uVar8 = 0;
          do {
            if (w != 0) {
              iVar5 = uVar8 + y;
              uVar6 = w;
              uVar12 = x;
              do {
                uVar3 = this->m_width - 1;
                if ((int)uVar12 < (int)uVar3) {
                  uVar3 = uVar12;
                }
                if ((int)uVar12 < 0) {
                  uVar3 = 0;
                }
                iVar9 = this->m_height - 1;
                if (iVar5 < iVar9) {
                  iVar9 = iVar5;
                }
                if (iVar5 < 0) {
                  iVar9 = 0;
                }
                pcVar11 = this->m_pPixels;
                uVar1 = iVar9 * this->m_pitch + uVar3;
                (pDst->field_0).field_0.r = pcVar11[uVar1].field_0.field_0.r;
                (pDst->field_0).field_0.g = pcVar11[uVar1].field_0.field_0.g;
                (pDst->field_0).field_0.b = pcVar11[uVar1].field_0.field_0.b;
                (pDst->field_0).field_0.a = pcVar11[uVar1].field_0.field_0.a;
                pDst = pDst + 1;
                uVar12 = uVar12 + 1;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != h);
        }
      }
      else if (h != 0) {
        pcVar11 = this->m_pPixels + (ulong)(y * this->m_pitch) + (ulong)x;
        do {
          memcpy(pDst,pcVar11,(ulong)w * 4);
          pcVar11 = pcVar11 + this->m_pitch;
          pDst = pDst + w;
          h = h - 1;
        } while (h != 0);
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool extract_block(color_type* pDst, uint x, uint y, uint w, uint h, bool flip_xy = false) const
        {
            if ((x >= m_width) || (y >= m_height))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (flip_xy)
            {
                for (uint y_ofs = 0; y_ofs < h; y_ofs++)
                {
                    for (uint x_ofs = 0; x_ofs < w; x_ofs++)
                    {
                        pDst[x_ofs * h + y_ofs] = get_clamped(x_ofs + x, y_ofs + y); // 5/4/12 - this was incorrectly x_ofs * 4
                    }
                }
            }
            else if (((x + w) > m_width) || ((y + h) > m_height))
            {
                for (uint y_ofs = 0; y_ofs < h; y_ofs++)
                {
                    for (uint x_ofs = 0; x_ofs < w; x_ofs++)
                    {
                        *pDst++ = get_clamped(x_ofs + x, y_ofs + y);
                    }
                }
            }
            else
            {
                const color_type* pSrc = get_scanline(y) + x;

                for (uint i = h; i; i--)
                {
                    memcpy(pDst, pSrc, w * sizeof(color_type));
                    pDst += w;

                    pSrc += m_pitch;
                }
            }

            return true;
        }